

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O3

void __thiscall
ParserTestMultipleOutputs::~ParserTestMultipleOutputs(ParserTestMultipleOutputs *this)

{
  ParserTest::~ParserTest(&this->super_ParserTest);
  operator_delete(this,0x1e8);
  return;
}

Assistant:

TEST_F(ParserTest, MultipleOutputs) {
  State local_state;
  ManifestParser parser(&local_state, NULL);
  string err;
  EXPECT_TRUE(parser.ParseTest("rule cc\n  command = foo\n  depfile = bar\n"
                               "build a.o b.o: cc c.cc\n",
                               &err));
  EXPECT_EQ("", err);
}